

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

exr_storage_t __thiscall Imf_3_3::Context::storage(Context *this,int partidx)

{
  exr_result_t eVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  int in_ESI;
  stringstream _iex_throw_s;
  exr_storage_t storage;
  stringstream *in_stack_fffffffffffffe18;
  __shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe20;
  exr_storage_t *in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  int part_index;
  exr_const_context_t in_stack_fffffffffffffe38;
  stringstream local_198 [16];
  ostream local_188 [328];
  Context *in_stack_ffffffffffffffc0;
  
  part_index = (int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  std::__shared_ptr_access<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe20);
  eVar1 = exr_get_storage(in_stack_fffffffffffffe38,part_index,in_stack_fffffffffffffe28);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    poVar2 = std::operator<<(local_188,"Unable to get storage type for part ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
    poVar2 = std::operator<<(poVar2," in file \'");
    pcVar3 = fileName(in_stack_ffffffffffffffc0);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\'");
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_fffffffffffffe18);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  return EXR_STORAGE_LAST_TYPE;
}

Assistant:

exr_storage_t
Context::storage (int partidx) const
{
    exr_storage_t storage = EXR_STORAGE_LAST_TYPE;

    if (EXR_ERR_SUCCESS != exr_get_storage (*_ctxt, partidx, &storage))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get storage type for part " << partidx << " in file '"
                                                   << fileName () << "'");
    }

    return storage;
}